

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

void __thiscall
ncnn::ConvolutionDepthWise::make_padding
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *bottom_blob_bordered,int _kernel_w,
          int _kernel_h,Option *opt)

{
  int in_ECX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  void *in_R9;
  Option opt_b_2;
  int hpad_1;
  int wpad_1;
  Option opt_b_1;
  int hpad;
  int wpad;
  Option opt_b;
  int kernel_extent_h;
  int kernel_extent_w;
  int h;
  int w;
  Mat *in_stack_fffffffffffffec0;
  Mat *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  undefined8 in_stack_ffffffffffffff00;
  Mat *in_stack_ffffffffffffff08;
  Mat *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff20;
  Option *in_stack_ffffffffffffff28;
  undefined1 local_c0 [8];
  undefined8 local_b8;
  int local_80;
  int local_7c;
  undefined1 local_78 [8];
  undefined8 local_70;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  void *local_28;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RDI + 0xdc) * (in_ECX + -1) + 1;
  local_38 = *(int *)(in_RDI + 0xe0) * (in_R8D + -1) + 1;
  local_28 = in_R9;
  ncnn::Mat::operator=(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  if ((((*(int *)(in_RDI + 0xec) < 1) && (*(int *)(in_RDI + 0xf0) < 1)) &&
      (*(int *)(in_RDI + 0xf4) < 1)) && (*(int *)(in_RDI + 0xf8) < 1)) {
    if (((*(int *)(in_RDI + 0xec) == -0xe9) && (*(int *)(in_RDI + 0xf0) == -0xe9)) &&
       ((*(int *)(in_RDI + 0xf4) == -0xe9 && (*(int *)(in_RDI + 0xf8) == -0xe9)))) {
      local_7c = (local_34 + ((local_2c + -1) / *(int *)(in_RDI + 0xe4)) * *(int *)(in_RDI + 0xe4))
                 - local_2c;
      local_80 = (local_38 + ((local_30 + -1) / *(int *)(in_RDI + 0xe8)) * *(int *)(in_RDI + 0xe8))
                 - local_30;
      if ((0 < local_7c) || (0 < local_80)) {
        memcpy(local_c0,local_28,0x40);
        local_b8 = *(undefined8 *)((long)local_28 + 0x10);
        copy_make_border(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                         (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                         (int)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                         in_stack_fffffffffffffef8,in_stack_ffffffffffffff20,
                         (float)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff28);
      }
    }
    else if (((*(int *)(in_RDI + 0xec) == -0xea) && (*(int *)(in_RDI + 0xf0) == -0xea)) &&
            ((*(int *)(in_RDI + 0xf4) == -0xea &&
             ((*(int *)(in_RDI + 0xf8) == -0xea &&
              ((0 < (local_34 +
                    ((local_2c + -1) / *(int *)(in_RDI + 0xe4)) * *(int *)(in_RDI + 0xe4)) -
                    local_2c ||
               (0 < (local_38 +
                    ((local_30 + -1) / *(int *)(in_RDI + 0xe8)) * *(int *)(in_RDI + 0xe8)) -
                    local_30)))))))) {
      memcpy(&stack0xfffffffffffffef8,local_28,0x40);
      copy_make_border(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                       (int)((ulong)*(undefined8 *)((long)local_28 + 0x10) >> 0x20),
                       (int)*(undefined8 *)((long)local_28 + 0x10),in_stack_fffffffffffffefc,
                       in_stack_fffffffffffffef8,in_stack_ffffffffffffff20,
                       (float)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff28);
    }
  }
  else {
    memcpy(local_78,local_28,0x40);
    local_70 = *(undefined8 *)((long)local_28 + 0x10);
    copy_make_border(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                     (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),(int)in_stack_ffffffffffffff00,
                     in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,in_stack_ffffffffffffff20,
                     (float)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff28);
  }
  return;
}

Assistant:

void ConvolutionDepthWise::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, int _kernel_w, int _kernel_h, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (_kernel_h - 1) + 1;

    bottom_blob_bordered = bottom_blob;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        // tensorflow padding=SAME or onnx padding=SAME_UPPER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        // onnx padding=SAME_LOWER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}